

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O2

bool __thiscall
Satyricon::SATSolver::new_clause
          (SATSolver *this,vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *c,
          bool learnt,ClausePtr *c_ref)

{
  literal_value lVar1;
  uint uVar2;
  pointer pLVar3;
  pointer pLVar4;
  pointer plVar5;
  pointer piVar6;
  uint *puVar7;
  bool bVar8;
  ulong uVar9;
  uint *puVar10;
  undefined7 in_register_00000011;
  size_type __new_size;
  ulong uVar11;
  long lVar12;
  size_t i;
  ulong uVar13;
  literal_value lVar14;
  ulong uVar15;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 local_30;
  
  *c_ref = (ClausePtr)0x0;
  if ((int)CONCAT71(in_register_00000011,learnt) == 0) {
    pLVar3 = (c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)(c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pLVar3 >> 2;
    plVar5 = (this->values).
             super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 1;
    __new_size = 0;
    for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
      uVar2 = pLVar3[uVar13].value;
      lVar1 = plVar5[uVar2 >> 1];
      lVar14 = LIT_TRUE - lVar1;
      if ((uVar2 & 1) == 0) {
        lVar14 = lVar1;
      }
      if (lVar14 != LIT_FALSE) {
        uVar15 = uVar11;
        if (lVar14 == LIT_TRUE) goto LAB_0011414e;
        while (uVar15 < uVar9) {
          pLVar4 = pLVar3 + uVar15;
          if (pLVar4->value == uVar2) goto LAB_0011408d;
          uVar15 = uVar15 + 1;
          if ((pLVar4->value ^ uVar2) == 1) goto LAB_0011414e;
        }
        pLVar3[__new_size].value = uVar2;
        __new_size = __new_size + 1;
      }
LAB_0011408d:
      uVar11 = uVar11 + 1;
    }
    std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::resize(c,__new_size);
  }
  pLVar3 = (c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pLVar4 = (c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar3 == pLVar4) {
    bVar8 = true;
  }
  else {
    if ((long)pLVar4 - (long)pLVar3 == 4) {
      bVar8 = assign(this,(Literal)pLVar3->value,(ClausePtr)0x0);
      return bVar8;
    }
    local_30.clause = Clause::allocate(c,learnt);
    *c_ref = (ClausePtr)local_30;
    if (learnt) {
      puVar10 = (uint *)(local_30.bits + 0xc);
      piVar6 = (this->decision_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar12 = 0x10; (ulong)(*(uint *)local_30.clause & 0xfffffffe) * -2 + 8 + lVar12 != 0x10;
          lVar12 = lVar12 + 4) {
        puVar7 = (uint *)(&(local_30.clause)->field_0x0 + lVar12);
        if (piVar6[*(uint *)(&(local_30.clause)->field_0x0 + lVar12) >> 1] <= piVar6[*puVar10 >> 1])
        {
          puVar7 = puVar10;
        }
        puVar10 = puVar7;
      }
      uVar2 = *puVar10;
      *puVar10 = *(uint *)(local_30.bits + 0xc);
      *(uint *)(local_30.bits + 0xc) = uVar2;
      Clause::update_activity(local_30.clause,(this->param).clause_activity_update);
      local_30.clause = *c_ref;
    }
    std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
    emplace_back<Satyricon::SATSolver::Watcher>
              ((this->watch_list).
               super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *(uint *)(local_30.bits + 8),
               (Watcher *)&local_30);
    local_30.clause = *c_ref;
    std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
    emplace_back<Satyricon::SATSolver::Watcher>
              ((this->watch_list).
               super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *(uint *)(local_30.bits + 0xc),
               (Watcher *)&local_30);
LAB_0011414e:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool SATSolver::new_clause(vector<Literal> &c, bool learnt, ClausePtr &c_ref) {

    c_ref = nullptr;

    if ( ! learnt ) { // simplify if possible, learned clause doesn't need this
        size_t j = 0;
        for ( size_t i = 0; i < c.size(); i++ ) {
            // discard false literal
            if ( get_asigned_value( c[i] ) == LIT_FALSE ) continue;
            // already satisfied?
            if ( get_asigned_value( c[i] ) == LIT_TRUE  )
                return false; // no conflict, new clause is a nullptr
            // look for tautology or repetition
            bool add = true;
            for ( size_t k = i+1; k < c.size(); ++k ) {
                if ( c[k] == c[i] ) { // repetition?
                    add = false;      // don't add the repeated literal
                    break;
                }
                if ( c[k] == !(c[i]) ) // tautology?
                    return false; // no conflict, new clause is a nullptr 
            }
            if ( add ) c[j++] = c[i];
        }
        c.resize(j);
    }

    // an empty clause is a conflict
    if (c.empty()) return true; // conflict, cnew clause is a nullptr

    // a clause with 1 literal is a unit, simply assign it
    if ( c.size() == 1 ) {
        // true if the assignment is in conflict, false otherwise
        // the new clause is a nullptr (don't build clause of one literal)
        return  assign( c[0], nullptr );
    }

    // build the clause
    c_ref = Clause::allocate(c,learnt);

    if ( learnt ) { 
        // pick a correct second literal to watch
        auto second = c_ref->begin()+1;
        for ( auto it = c_ref->begin()+2; it != c_ref->end(); ++it)
            if ( decision_levels[it->var()] > decision_levels[second->var()] )
                second = it;
        // swap
        Literal tmp = *second;
        *second = c_ref->at(1);
        c_ref->at(1) = tmp;

        // increase activity
        c_ref->update_activity( param.clause_activity_update );
    }

    //  add to the watch list
    watch_list[c_ref->at(0).index()].push_back(Watcher(c_ref));
    watch_list[c_ref->at(1).index()].push_back(Watcher(c_ref));

    return false; // no conflict
}